

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::ProgramContext::ProgramContext
          (ProgramContext *this,string *vs,string *fs,
          vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
          *attrs,string *desc)

{
  string *desc_local;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  *attrs_local;
  string *fs_local;
  string *vs_local;
  ProgramContext *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)vs);
  std::__cxx11::string::string((string *)&this->fragShaderSource,(string *)fs);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector(&this->attributes,attrs);
  std::__cxx11::string::string((string *)&this->description,(string *)desc);
  return;
}

Assistant:

ProgramContext (const string& vs, const string& fs, const vector<AttribSpec>& attrs, const string& desc)
			: vertShaderSource(vs), fragShaderSource(fs), attributes(attrs), description(desc) {}